

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::UniquenessConstraintSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,UniquenessConstraintSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  OpenRangeListSyntax *node;
  size_t index_local;
  UniquenessConstraintSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->unique).kind;
    token._2_1_ = (this->unique).field_0x2;
    token.numFlags.raw = (this->unique).numFlags.raw;
    token.rawLen = (this->unique).rawLen;
    token.info = (this->unique).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    node = not_null<slang::syntax::OpenRangeListSyntax_*>::get(&this->ranges);
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&node->super_SyntaxNode);
  }
  else if (index == 2) {
    token_00.kind = (this->semi).kind;
    token_00._2_1_ = (this->semi).field_0x2;
    token_00.numFlags.raw = (this->semi).numFlags.raw;
    token_00.rawLen = (this->semi).rawLen;
    token_00.info = (this->semi).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax UniquenessConstraintSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return unique;
        case 1: return ranges.get();
        case 2: return semi;
        default: return nullptr;
    }
}